

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzrot.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChNodeFEAxyzrot::ChNodeFEAxyzrot(ChNodeFEAxyzrot *this,ChFrame<double> *initialf)

{
  undefined1 *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ChVector<double> local_d8;
  ChFrame<double> local_b8;
  
  ChNodeBase::ChNodeBase((ChNodeBase *)&this->field_0x2b8);
  this_00 = &(this->super_ChNodeFEAbase).field_0x18;
  this->super_ChLoadableUVW = (ChLoadableUVW)&PTR__ChLoadable_00b04a88;
  (this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase = (_func_int **)0xb2cd60;
  *(undefined8 *)&this->field_0x2b8 = 0xb2ce60;
  local_b8._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_d8.m_data[2] = 0.0;
  local_d8.m_data[0] = 0.0;
  local_d8.m_data[1] = 0.0;
  local_b8.coord.pos.m_data[0] = 0.0;
  local_b8.coord.pos.m_data[1] = 0.0;
  local_b8.coord.pos.m_data[2] = 0.0;
  ChFrameMoving<double>::ChFrameMoving
            ((ChFrameMoving<double> *)this_00,&local_d8,(ChQuaternion<double> *)&local_b8);
  (this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase = (_func_int **)0xb2c870;
  *(undefined8 *)&this->field_0x2b8 = 0xb2cc50;
  *(undefined8 *)&(this->super_ChNodeFEAbase).field_0x18 = 0xb2c9e0;
  (this->super_ChVariableTupleCarrier_1vars<6>)._vptr_ChVariableTupleCarrier_1vars =
       (_func_int **)(vtable + 0x228);
  this->super_ChLoadableUVW = (ChLoadableUVW)0xb2cb08;
  ChVariablesBodyOwnMass::ChVariablesBodyOwnMass(&this->variables);
  local_b8._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_b8.coord.pos.m_data[2] = 0.0;
  local_b8.coord.pos.m_data[0] = 0.0;
  local_b8.coord.pos.m_data[1] = 0.0;
  (this->X0)._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  (this->X0).coord.pos.m_data[0] = 0.0;
  (this->X0).coord.pos.m_data[1] = 0.0;
  (this->X0).coord.pos.m_data[2] = 0.0;
  (this->X0).coord.rot.m_data[0] = 1.0;
  (this->X0).coord.rot.m_data[1] = 0.0;
  (this->X0).coord.rot.m_data[2] = 0.0;
  (this->X0).coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&(this->X0).Amatrix,(ChQuaternion<double> *)&local_b8);
  auVar1._8_8_ = DAT_00b689a0;
  auVar1._0_8_ = VNULL;
  auVar3._8_8_ = DAT_00b689a8;
  auVar3._0_8_ = DAT_00b689a0;
  auVar2 = vunpcklpd_avx(auVar1,auVar3);
  auVar1 = vshufpd_avx(auVar3,auVar1,1);
  *(undefined1 (*) [16])((this->Force).m_data + 2) = auVar1;
  *(undefined1 (*) [16])(this->Force).m_data = auVar2;
  *(undefined1 (*) [16])((this->Torque).m_data + 1) = auVar3;
  ChFrameMoving<double>::operator=((ChFrameMoving<double> *)this_00,initialf);
  local_b8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  local_b8.coord.pos.m_data[0] = (initialf->coord).pos.m_data[0];
  local_b8.coord.pos.m_data[1] = (initialf->coord).pos.m_data[1];
  local_b8.coord.pos.m_data[2] = (initialf->coord).pos.m_data[2];
  local_b8.coord.rot.m_data[0] = (initialf->coord).rot.m_data[0];
  local_b8.coord.rot.m_data[1] = (initialf->coord).rot.m_data[1];
  local_b8.coord.rot.m_data[2] = (initialf->coord).rot.m_data[2];
  local_b8.coord.rot.m_data[3] = (initialf->coord).rot.m_data[3];
  local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (initialf->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (initialf->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (initialf->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       (initialf->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       (initialf->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       (initialf->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       (initialf->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       (initialf->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       (initialf->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  ChFrame<double>::operator=(&this->X0,&local_b8);
  ChVariablesBodyOwnMass::SetBodyMass(&this->variables,0.0);
  *(double *)
   ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x40
   ) = 0.0;
  (this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  *(double *)
   ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 8) =
       0.0;
  *(double *)
   ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x10
   ) = 0.0;
  *(double *)
   ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x18
   ) = 0.0;
  *(double *)
   ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x20
   ) = 0.0;
  *(double *)
   ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x28
   ) = 0.0;
  *(double *)
   ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x30
   ) = 0.0;
  *(double *)
   ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x38
   ) = 0.0;
  return;
}

Assistant:

ChNodeFEAxyzrot::ChNodeFEAxyzrot(ChFrame<> initialf) : Force(VNULL), Torque(VNULL) {
    this->Frame() = initialf;
    X0 = ChFrame<>(initialf);

    variables.SetBodyMass(0.0);
    variables.GetBodyInertia().setZero();
}